

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void referenceSplit(void *ctx,xmlChar *name)

{
  xmlSchemaSAXPlugPtr ctxt;
  xmlChar *name_local;
  void *ctx_local;
  
  if (ctx != (void *)0x0) {
    if (((ctx != (void *)0x0) && (*(long *)((long)ctx + 0x10) != 0)) &&
       (*(long *)(*(long *)((long)ctx + 0x10) + 0x80) != 0)) {
      (**(code **)(*(long *)((long)ctx + 0x10) + 0x80))(*(undefined8 *)((long)ctx + 0x20),name);
    }
    if (*(long *)((long)ctx + 0x128) != 0) {
      xmlSchemaSAXHandleReference(*(void **)((long)ctx + 0x20),name);
    }
  }
  return;
}

Assistant:

static void
referenceSplit(void *ctx, const xmlChar *name)
{
    xmlSchemaSAXPlugPtr ctxt = (xmlSchemaSAXPlugPtr) ctx;
    if (ctxt == NULL)
        return;
    if ((ctxt != NULL) && (ctxt->user_sax != NULL) &&
        (ctxt->user_sax->reference != NULL))
	ctxt->user_sax->reference(ctxt->user_data, name);
    if (ctxt->ctxt != NULL)
        xmlSchemaSAXHandleReference(ctxt->user_data, name);
}